

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatSolver.c
# Opt level: O3

void xSAT_SolverCancelUntil(xSAT_Solver_t *s,int Level)

{
  uint uVar1;
  xSAT_Heap_t *h;
  Vec_Int_t *p;
  uint uVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  uint Entry;
  
  if (s->vTrailLim->nSize <= Level) {
    return;
  }
  if ((-1 < Level) && (pVVar4 = s->vTrailLim, Level < pVVar4->nSize)) {
    uVar7 = (ulong)(uint)s->vTrail->nSize;
    do {
      piVar5 = pVVar4->pArray;
      iVar3 = piVar5[(uint)Level];
      iVar6 = (int)uVar7;
      if (iVar6 <= iVar3) {
        s->iQhead = iVar3;
        iVar3 = piVar5[(uint)Level];
        if ((iVar3 <= s->vTrail->nSize) && (s->vTrail->nSize = iVar3, Level <= pVVar4->nSize)) {
          pVVar4->nSize = Level;
          return;
        }
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
      }
      if ((iVar6 < 1) || (s->vTrail->nSize < iVar6)) break;
      Entry = s->vTrail->pArray[uVar7 - 1] >> 1;
      if (((int)Entry < 0) || (s->vAssigns->nSize <= (int)Entry)) {
LAB_00904de0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
      }
      s->vAssigns->pArray[Entry] = '\x03';
      if (s->vReasons->nSize <= (int)Entry) goto LAB_00904dff;
      s->vReasons->pArray[Entry] = -1;
      if (s->vTrail->nSize < iVar6) break;
      if (s->vPolarity->nSize <= (int)Entry) goto LAB_00904de0;
      s->vPolarity->pArray[Entry] = *(byte *)(s->vTrail->pArray + (uVar7 - 1)) & 1;
      h = s->hOrder;
      pVVar4 = h->vIndices;
      iVar3 = pVVar4->nSize;
      if ((int)Entry < iVar3) {
        if (pVVar4->pArray[Entry] < 0) goto LAB_00904d2f;
      }
      else {
        uVar1 = Entry + 1;
        uVar2 = pVVar4->nCap * 2;
        if ((int)Entry < (int)uVar2) {
          if (pVVar4->nCap <= (int)Entry) {
            if (pVVar4->pArray == (int *)0x0) {
              piVar5 = (int *)malloc((ulong)uVar2 << 2);
            }
            else {
              piVar5 = (int *)realloc(pVVar4->pArray,(ulong)uVar2 << 2);
            }
            pVVar4->pArray = piVar5;
            goto joined_r0x00904cc8;
          }
        }
        else {
          if (pVVar4->pArray == (int *)0x0) {
            piVar5 = (int *)malloc((ulong)uVar1 << 2);
          }
          else {
            piVar5 = (int *)realloc(pVVar4->pArray,(ulong)uVar1 << 2);
          }
          pVVar4->pArray = piVar5;
          uVar2 = uVar1;
joined_r0x00904cc8:
          if (piVar5 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar4->nCap = uVar2;
          iVar3 = pVVar4->nSize;
        }
        if (iVar3 <= (int)Entry) {
          memset(pVVar4->pArray + iVar3,0xff,(ulong)(Entry - iVar3) * 4 + 4);
        }
        pVVar4->nSize = uVar1;
        pVVar4 = h->vIndices;
        iVar3 = pVVar4->nSize;
LAB_00904d2f:
        if (iVar3 <= (int)Entry) {
LAB_00904dff:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        if (-1 < pVVar4->pArray[Entry]) {
          __assert_fail("!xSAT_HeapInHeap( p, n )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatHeap.h"
                        ,0xe6,"void xSAT_HeapInsert(xSAT_Heap_t *, int)");
        }
        p = h->vHeap;
        pVVar4->pArray[Entry] = p->nSize;
        Vec_IntPush(p,Entry);
        if (h->vIndices->nSize <= (int)Entry) break;
        xSAT_HeapPercolateUp(h,h->vIndices->pArray[Entry]);
      }
      pVVar4 = s->vTrailLim;
      uVar7 = uVar7 - 1;
    } while (Level < pVVar4->nSize);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void xSAT_SolverCancelUntil( xSAT_Solver_t * s, int Level )
{
    int c;

    if ( xSAT_SolverDecisionLevel( s ) <= Level )
        return;

    for ( c = Vec_IntSize( s->vTrail ) - 1; c >= Vec_IntEntry( s->vTrailLim, Level ); c-- )
    {
        int Var = xSAT_Lit2Var( Vec_IntEntry( s->vTrail, c ) );

        Vec_StrWriteEntry( s->vAssigns, Var, VarX );
        Vec_IntWriteEntry( s->vReasons, Var, ( int ) CRefUndef );
        Vec_StrWriteEntry( s->vPolarity, Var, ( char )xSAT_LitSign( Vec_IntEntry( s->vTrail, c ) ) );

        if ( !xSAT_HeapInHeap( s->hOrder, Var ) )
            xSAT_HeapInsert( s->hOrder, Var );
    }

    s->iQhead = Vec_IntEntry( s->vTrailLim, Level );
    Vec_IntShrink( s->vTrail, Vec_IntEntry( s->vTrailLim, Level ) );
    Vec_IntShrink( s->vTrailLim, Level );
}